

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_fix.cpp
# Opt level: O2

void Omega_h::compute_ill_metric_dim<3>(Mesh *mesh,AdaptOpts *opts,Omega_h_Isotropy isotropy)

{
  Real RVar1;
  LO LVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  allocator local_1c9;
  Mesh *local_1c8;
  string local_1c0;
  int local_19c;
  Reals metrics;
  Reals elem_metrics;
  type f;
  Write<double> elem_metrics_w;
  Write<double> local_130;
  Write<double> local_120;
  Write<double> local_110;
  Write<double> local_100;
  Write<double> local_f0;
  Write<double> local_e0;
  Write<double> local_d0;
  Write<double> local_c0;
  Read<double> prelim_quals;
  Write<double> local_a0;
  Write<double> local_90;
  Write<double> local_80;
  Write<double> local_70;
  undefined1 local_60 [32];
  Write<double> local_40;
  
  std::__cxx11::string::string((string *)&f,"metric",(allocator *)&local_1c0);
  Mesh::remove_tag(mesh,0,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  std::operator<<((ostream *)&std::cout,"getting element implied metrics\n");
  get_element_implied_length_metrics((Omega_h *)&elem_metrics,mesh);
  local_1c8 = mesh;
  LVar2 = Mesh::nelems(mesh);
  Write<double>::Write(&local_70,&elem_metrics.write_);
  apply_isotropy((Omega_h *)&f,LVar2,(Reals *)&local_70,isotropy);
  Write<double>::operator=(&elem_metrics.write_,(Write<signed_char> *)&f);
  Write<double>::~Write((Write<double> *)&f);
  Write<double>::~Write(&local_70);
  if (((ulong)elem_metrics.write_.shared_alloc_.alloc & 1) == 0) {
    uVar6 = (elem_metrics.write_.shared_alloc_.alloc)->size;
  }
  else {
    uVar6 = (ulong)elem_metrics.write_.shared_alloc_.alloc >> 3;
  }
  LVar2 = Mesh::nelems(local_1c8);
  local_19c = divide_no_remainder<int>((int)(uVar6 >> 3),LVar2);
  std::__cxx11::string::string((string *)&f,"metric",(allocator *)&local_1c0);
  Write<double>::Write(&local_80,&elem_metrics.write_);
  Mesh::add_tag<double>(local_1c8,3,(string *)&f,local_19c,(Read<double> *)&local_80,false);
  Write<double>::~Write(&local_80);
  std::__cxx11::string::~string((string *)&f);
  std::operator<<((ostream *)&std::cout,"projecting them\n");
  Write<double>::Write(&local_90,&elem_metrics.write_);
  project_metrics((Omega_h *)&metrics,local_1c8,(Reals *)&local_90);
  Write<double>::~Write(&local_90);
  if (((ulong)metrics.write_.shared_alloc_.alloc & 1) == 0) {
    uVar6 = (metrics.write_.shared_alloc_.alloc)->size;
  }
  else {
    uVar6 = (ulong)metrics.write_.shared_alloc_.alloc >> 3;
  }
  LVar2 = Mesh::nverts(local_1c8);
  iVar3 = divide_no_remainder<int>((int)(uVar6 >> 3),LVar2);
  if (local_19c == iVar3) {
    if (isotropy == OMEGA_H_ANISOTROPIC) {
      for (iVar3 = 0; iVar3 != 5; iVar3 = iVar3 + 1) {
        poVar5 = std::operator<<((ostream *)&std::cout,"metric smoothing iteration ");
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar3);
        std::operator<<(poVar5,'\n');
        Write<double>::Write(&local_40,&metrics.write_);
        smooth_metric_once((Omega_h *)&f,local_1c8,(Reals *)&local_40,true);
        Write<double>::operator=(&metrics.write_,(Write<signed_char> *)&f);
        Write<double>::~Write((Write<double> *)&f);
        Write<double>::~Write(&local_40);
      }
    }
    std::__cxx11::string::string((string *)&f,"metric",(allocator *)&local_1c0);
    Write<double>::Write(&local_a0,&metrics.write_);
    Mesh::add_tag<double>(local_1c8,0,(string *)&f,local_19c,(Read<double> *)&local_a0,false);
    Write<double>::~Write(&local_a0);
    std::__cxx11::string::~string((string *)&f);
    std::operator<<((ostream *)&std::cout,"computing qualities\n");
    Mesh::ask_qualities((Mesh *)(local_60 + 0x10));
    Write<double>::~Write((Write<double> *)(local_60 + 0x10));
    uVar4 = Mesh::dim(local_1c8);
    std::__cxx11::string::string((string *)&f,"quality",(allocator *)&local_1c0);
    Mesh::get_array<double>((Mesh *)&prelim_quals,(Int)local_1c8,(string *)(ulong)uVar4);
    std::__cxx11::string::~string((string *)&f);
    RVar1 = opts->min_quality_allowed;
    std::operator<<((ostream *)&std::cout,"removing low-quality contributions\n");
    Write<double>::Write(&local_c0,&elem_metrics.write_);
    std::__cxx11::string::string((string *)&f,"",(allocator *)&local_1c0);
    deep_copy<double>((Omega_h *)&elem_metrics_w,(Read<signed_char> *)&local_c0,(string *)&f);
    std::__cxx11::string::~string((string *)&f);
    Write<double>::~Write(&local_c0);
    Write<double>::Write((Write<double> *)&f,&prelim_quals.write_);
    f.ncomps = local_19c;
    f.min_qual = RVar1;
    Write<double>::Write(&f.elem_metrics_w,&elem_metrics_w);
    LVar2 = Mesh::nelems(local_1c8);
    parallel_for<Omega_h::compute_ill_metric_dim<3>(Omega_h::Mesh*,Omega_h::AdaptOpts_const&,Omega_h_Isotropy)::_lambda(int)_1_>
              (LVar2,&f,"ignore_low_quality_implied");
    Write<double>::Write(&local_d0,&elem_metrics_w);
    Read<double>::Read((Read<signed_char> *)&local_1c0,&local_d0);
    Write<double>::operator=(&elem_metrics.write_,(Write<signed_char> *)&local_1c0);
    Write<double>::~Write((Write<double> *)&local_1c0);
    Write<double>::~Write(&local_d0);
    std::operator<<((ostream *)&std::cout,"done removing low-quality contributions\n");
    std::__cxx11::string::string((string *)&local_1c0,"metric",&local_1c9);
    Mesh::remove_tag(local_1c8,3,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::string((string *)&local_1c0,"metric",&local_1c9);
    Write<double>::Write(&local_e0,&elem_metrics.write_);
    Mesh::add_tag<double>(local_1c8,3,&local_1c0,local_19c,(Read<double> *)&local_e0,false);
    Write<double>::~Write(&local_e0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::operator<<((ostream *)&std::cout,"projecting metrics elem -> node\n");
    Write<double>::Write(&local_f0,&elem_metrics.write_);
    project_metrics((Omega_h *)&local_1c0,local_1c8,(Reals *)&local_f0);
    Write<double>::operator=(&metrics.write_,(Write<signed_char> *)&local_1c0);
    Write<double>::~Write((Write<double> *)&local_1c0);
    Write<double>::~Write(&local_f0);
    std::__cxx11::string::string((string *)&local_1c0,"metric",&local_1c9);
    Mesh::remove_tag(local_1c8,0,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::string((string *)&local_1c0,"metric",&local_1c9);
    if (((ulong)metrics.write_.shared_alloc_.alloc & 1) == 0) {
      uVar6 = (metrics.write_.shared_alloc_.alloc)->size;
    }
    else {
      uVar6 = (ulong)metrics.write_.shared_alloc_.alloc >> 3;
    }
    LVar2 = Mesh::nverts(local_1c8);
    iVar3 = divide_no_remainder<int>((int)(uVar6 >> 3),LVar2);
    Write<double>::Write(&local_100,&metrics.write_);
    Mesh::add_tag<double>(local_1c8,0,&local_1c0,iVar3,(Read<double> *)&local_100,false);
    Write<double>::~Write(&local_100);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::string((string *)&local_1c0,"metric",&local_1c9);
    Mesh::remove_tag(local_1c8,0,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::string((string *)&local_1c0,"metric",&local_1c9);
    if (((ulong)metrics.write_.shared_alloc_.alloc & 1) == 0) {
      uVar6 = (metrics.write_.shared_alloc_.alloc)->size;
    }
    else {
      uVar6 = (ulong)metrics.write_.shared_alloc_.alloc >> 3;
    }
    LVar2 = Mesh::nverts(local_1c8);
    iVar3 = divide_no_remainder<int>((int)(uVar6 >> 3),LVar2);
    Write<double>::Write(&local_110,&metrics.write_);
    Mesh::add_tag<double>(local_1c8,0,&local_1c0,iVar3,(Read<double> *)&local_110,false);
    Write<double>::~Write(&local_110);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::operator<<((ostream *)&std::cout,"limiting metric gradation\n");
    Write<double>::Write(&local_120,&metrics.write_);
    limit_metric_gradation((Omega_h *)&local_1c0,local_1c8,(Reals *)&local_120,1.0,0.01,true);
    Write<double>::operator=(&metrics.write_,(Write<signed_char> *)&local_1c0);
    Write<double>::~Write((Write<double> *)&local_1c0);
    Write<double>::~Write(&local_120);
    std::__cxx11::string::string((string *)&local_1c0,"metric",&local_1c9);
    Mesh::remove_tag(local_1c8,0,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::string((string *)&local_1c0,"metric",&local_1c9);
    if (((ulong)metrics.write_.shared_alloc_.alloc & 1) == 0) {
      uVar6 = (metrics.write_.shared_alloc_.alloc)->size;
    }
    else {
      uVar6 = (ulong)metrics.write_.shared_alloc_.alloc >> 3;
    }
    LVar2 = Mesh::nverts(local_1c8);
    iVar3 = divide_no_remainder<int>((int)(uVar6 >> 3),LVar2);
    Write<double>::Write(&local_130,&metrics.write_);
    Mesh::add_tag<double>(local_1c8,0,&local_1c0,iVar3,(Read<double> *)&local_130,false);
    Write<double>::~Write(&local_130);
    std::__cxx11::string::~string((string *)&local_1c0);
    Mesh::ask_qualities((Mesh *)local_60);
    Write<double>::~Write((Write<double> *)local_60);
    std::operator<<((ostream *)&std::cout,"done with \"ill\" metric\n");
    compute_ill_metric_dim<3>(Omega_h::Mesh*,Omega_h::AdaptOpts_const&,Omega_h_Isotropy)::
    {lambda(int)#1}::~Omega_h_Isotropy((_lambda_int__1_ *)&f);
    Write<double>::~Write(&elem_metrics_w);
    Write<double>::~Write(&prelim_quals.write_);
    Write<double>::~Write(&metrics.write_);
    Write<double>::~Write(&elem_metrics.write_);
    return;
  }
  fail("assertion %s failed at %s +%d\n",
       "ncomps == divide_no_remainder(metrics.size(), mesh->nverts())",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_fix.cpp"
       ,0x1b);
}

Assistant:

void compute_ill_metric_dim(
    Mesh* mesh, AdaptOpts const& opts, Omega_h_Isotropy isotropy) {
  mesh->remove_tag(VERT, "metric");
  std::cout << "getting element implied metrics\n";
  auto elem_metrics = get_element_implied_length_metrics(mesh);
  elem_metrics = apply_isotropy(mesh->nelems(), elem_metrics, isotropy);
  auto ncomps = divide_no_remainder(elem_metrics.size(), mesh->nelems());
  mesh->add_tag(dim, "metric", ncomps, elem_metrics);
  std::cout << "projecting them\n";
  auto metrics = project_metrics(mesh, elem_metrics);
  OMEGA_H_CHECK(ncomps == divide_no_remainder(metrics.size(), mesh->nverts()));
  if (isotropy == OMEGA_H_ANISOTROPIC) {
    for (Int i = 0; i < 5; ++i) {
      std::cout << "metric smoothing iteration " << i << '\n';
      metrics = smooth_metric_once(mesh, metrics, true);
    }
  }
  mesh->add_tag(VERT, "metric", ncomps, metrics);
  std::cout << "computing qualities\n";
  mesh->ask_qualities();
  auto prelim_quals = mesh->get_array<Real>(mesh->dim(), "quality");
  auto min_qual = opts.min_quality_allowed;
  std::cout << "removing low-quality contributions\n";
  auto elem_metrics_w = deep_copy(elem_metrics);
  auto f = OMEGA_H_LAMBDA(LO e) {
    if (prelim_quals[e] < min_qual) {
      for (Int i = 0; i < ncomps; ++i) {
        elem_metrics_w[e * ncomps + i] = 0.;
      }
    }
  };
  parallel_for(mesh->nelems(), f, "ignore_low_quality_implied");
  elem_metrics = Reals(elem_metrics_w);
  std::cout << "done removing low-quality contributions\n";
  mesh->remove_tag(dim, "metric");
  mesh->add_tag(dim, "metric", ncomps, elem_metrics);
  std::cout << "projecting metrics elem -> node\n";
  metrics = project_metrics(mesh, elem_metrics);
  mesh->remove_tag(VERT, "metric");
  mesh->add_tag(VERT, "metric",
      divide_no_remainder(metrics.size(), mesh->nverts()), metrics);
  mesh->remove_tag(VERT, "metric");
  mesh->add_tag(VERT, "metric",
      divide_no_remainder(metrics.size(), mesh->nverts()), metrics);
  std::cout << "limiting metric gradation\n";
  metrics = limit_metric_gradation(mesh, metrics, 1.0);
  mesh->remove_tag(VERT, "metric");
  mesh->add_tag(VERT, "metric",
      divide_no_remainder(metrics.size(), mesh->nverts()), metrics);
  mesh->ask_qualities();
  std::cout << "done with \"ill\" metric\n";
}